

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::AddNewConnection(cmServerBase *this,cmConnection *ownedConnection)

{
  unique_lock<cm::shared_mutex> lock;
  cmConnection *local_30;
  unique_lock<cm::shared_mutex> local_28;
  
  local_28._M_device = &this->ConnectionsMutex;
  local_28._M_owns = false;
  local_30 = ownedConnection;
  std::unique_lock<cm::shared_mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::
  vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
  ::emplace_back<cmConnection*&>
            ((vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
              *)&this->Connections,&local_30);
  std::unique_lock<cm::shared_mutex>::~unique_lock(&local_28);
  (*local_30->_vptr_cmConnection[5])(local_30,this);
  return;
}

Assistant:

void cmServerBase::AddNewConnection(cmConnection* ownedConnection)
{
  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    Connections.emplace_back(ownedConnection);
  }
  ownedConnection->SetServer(this);
}